

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_folders.cpp
# Opt level: O2

void sago::internal::appendExtraFoldersTokenizer
               (char *envName,char *envValue,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *folders)

{
  istream *piVar1;
  ostream *poVar2;
  allocator<char> local_1d9;
  string value;
  stringstream ss;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&value,envValue,&local_1d9);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&value,_S_out|_S_in);
  std::__cxx11::string::~string((string *)&value);
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&ss,(string *)&value,':');
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    if (*value._M_dataplus._M_p == '/') {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(folders,&value);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Skipping path \"");
      poVar2 = std::operator<<(poVar2,(string *)&value);
      poVar2 = std::operator<<(poVar2,"\" in \"");
      poVar2 = std::operator<<(poVar2,envName);
      std::operator<<(poVar2,"\" because it does not start with a \"/\"\n");
    }
  }
  std::__cxx11::string::~string((string *)&value);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

void appendExtraFoldersTokenizer(const char* envName, const char* envValue, std::vector<std::string>& folders) {
	std::stringstream ss(envValue);
	std::string value;
	while (std::getline(ss, value, ':')) {
		if (value[0] == '/') {
			folders.push_back(value);
		}
		else {
			//Unless the system is wrongly configured this should never happen... But of course some systems will be incorectly configured.
			//The XDG documentation indicates that the folder should be ignored but that the program should continue.
			std::cerr << "Skipping path \"" << value << "\" in \"" << envName << "\" because it does not start with a \"/\"\n";
		}
	}
}